

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O2

void ihevc_intra_pred_luma_mode_27_to_33
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  iVar1 = gai4_ihevc_ang_table[mode];
  uVar4 = 0;
  uVar5 = 0;
  if (0 < nt) {
    uVar5 = (ulong)(uint)nt;
  }
  while (uVar4 != uVar5) {
    uVar4 = uVar4 + 1;
    uVar2 = iVar1 * (int)uVar4;
    uVar3 = uVar2 & 0x1f;
    for (uVar7 = 0; (uint)nt != uVar7; uVar7 = uVar7 + 1) {
      lVar6 = (long)(((int)uVar2 >> 5) + nt * 2 + (int)uVar7);
      pu1_dst[uVar7] =
           (UWORD8)(pu1_ref[lVar6 + 2] * uVar3 + (uint)pu1_ref[lVar6 + 1] * (0x20 - uVar3) + 0x10 >>
                   5);
    }
    pu1_dst = pu1_dst + dst_strd;
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_mode_27_to_33(UWORD8 *pu1_ref,
                                         WORD32 src_strd,
                                         UWORD8 *pu1_dst,
                                         WORD32 dst_strd,
                                         WORD32 nt,
                                         WORD32 mode)
{
    WORD32 row, col;
    WORD32 two_nt, pos, fract;
    WORD32 intra_pred_ang;
    WORD32 idx, ref_main_idx;
    UNUSED(src_strd);
    two_nt = 2 * nt;
    intra_pred_ang = gai4_ihevc_ang_table[mode];

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(col = 0; col < nt; col++)
        {
            ref_main_idx = two_nt + col + idx + 1;
            pu1_dst[col + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx]
                            + fract * pu1_ref[ref_main_idx + 1] + 16) >> 5);
        }

    }

}